

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_struct.h
# Opt level: O2

void __thiscall t_struct::validate_union_member(t_struct *this,t_field *field)

{
  string *__rhs;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->is_union_ == true) && ((this->super_t_type).name_._M_string_length != 0)) {
    __rhs = &(this->super_t_type).name_;
    if (field->req_ != T_OPTIONAL) {
      if (field->req_ != T_OPT_IN_REQ_OUT) {
        pwarning(1,
                 "Union %s field %s: union members must be optional, ignoring specified requiredness.\n"
                 ,(__rhs->_M_dataplus)._M_p,(field->name_)._M_dataplus._M_p);
      }
      field->req_ = T_OPTIONAL;
    }
    if (field->value_ != (t_const_value *)0x0) {
      iVar1 = this->members_with_value;
      this->members_with_value = iVar1 + 1;
      if (0 < iVar1) {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
        std::operator+(&local_60,"Error: Field ",&field->name_);
        std::operator+(&local_40,&local_60," provides another default value for union ");
        std::operator+(__return_storage_ptr__,&local_40,__rhs);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
    }
  }
  return;
}

Assistant:

void validate_union_member(t_field* field) {
    if (is_union_ && (!name_.empty())) {

      // 1) unions can't have required fields
      // 2) union members are implicitly optional, otherwise bugs like THRIFT-3650 wait to happen
      if (field->get_req() != t_field::T_OPTIONAL) {
        // no warning on default requiredness, but do warn on anything else that is explicitly asked for
        if(field->get_req() != t_field::T_OPT_IN_REQ_OUT) {
          pwarning(1,
                   "Union %s field %s: union members must be optional, ignoring specified requiredness.\n",
                   name_.c_str(),
                   field->get_name().c_str());
        }
        field->set_req(t_field::T_OPTIONAL);
      }

      // unions may have up to one member defaulted, but not more
      if (field->get_value() != nullptr) {
        if (1 < ++members_with_value) {
          throw "Error: Field " + field->get_name() + " provides another default value for union "
              + name_;
        }
      }
    }
  }